

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  this->Indent = 0.0;
  this->ColumnsOffset = 0.0;
  (this->GroupOffset).x = 0.0;
  (this->MenuBarOffset).x = 0.0;
  (this->MenuBarOffset).y = 0.0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  (this->CurrLineSize).x = 0.0;
  (this->CurrLineSize).y = 0.0;
  (this->PrevLineSize).x = 0.0;
  (this->PrevLineSize).y = 0.0;
  (this->LastItemRect).Min.x = 0.0;
  (this->LastItemRect).Min.y = 0.0;
  (this->LastItemRect).Max.x = 0.0;
  (this->LastItemRect).Max.y = 0.0;
  (this->LastItemDisplayRect).Min.x = 0.0;
  (this->LastItemDisplayRect).Min.y = 0.0;
  (this->LastItemDisplayRect).Max.x = 0.0;
  (this->LastItemDisplayRect).Max.y = 0.0;
  ImGuiMenuColumns::ImGuiMenuColumns(&this->MenuColumns);
  (this->ChildWindows).Size = 0;
  (this->ChildWindows).Capacity = 0;
  (this->ChildWindows).Data = (ImGuiWindow **)0x0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  (this->CurrLineSize).x = 0.0;
  (this->CurrLineSize).y = 0.0;
  (this->PrevLineSize).x = 0.0;
  (this->PrevLineSize).y = 0.0;
  this->CurrLineTextBaseOffset = 0.0;
  this->PrevLineTextBaseOffset = 0.0;
  this->Indent = 0.0;
  this->ColumnsOffset = 0.0;
  this->ColumnsOffset = 0.0;
  this->GroupOffset = 0.0;
  this->LastItemId = 0;
  this->LastItemStatusFlags = 0;
  (this->ItemFlagsStack).Size = 0;
  (this->ItemFlagsStack).Capacity = 0;
  (this->ItemFlagsStack).Data = (int *)0x0;
  (this->ItemWidthStack).Size = 0;
  (this->ItemWidthStack).Capacity = 0;
  (this->ItemWidthStack).Data = (float *)0x0;
  (this->TextWrapPosStack).Size = 0;
  (this->TextWrapPosStack).Capacity = 0;
  (this->TextWrapPosStack).Data = (float *)0x0;
  (this->GroupStack).Size = 0;
  (this->GroupStack).Capacity = 0;
  (this->GroupStack).Data = (ImGuiGroupData *)0x0;
  (this->LastItemRect).Min.x = 0.0;
  (this->LastItemRect).Min.y = 0.0;
  (this->LastItemRect).Max.x = 0.0;
  (this->LastItemRect).Max.y = 0.0;
  (this->LastItemDisplayRect).Min.x = 0.0;
  (this->LastItemDisplayRect).Min.y = 0.0;
  (this->LastItemDisplayRect).Max.x = 0.0;
  (this->LastItemDisplayRect).Max.y = 0.0;
  this->NavLayerCurrent = ImGuiNavLayer_Main;
  this->NavLayerCurrentMask = 1;
  this->NavLayerActiveMask = 0;
  this->NavLayerActiveMaskNext = 0;
  (this->MenuBarOffset).x = 0.0;
  (this->MenuBarOffset).y = 0.0;
  this->TreeDepth = 0;
  this->TreeJumpToParentOnPopMask = 0;
  this->NavFocusScopeIdCurrent = 0;
  *(undefined4 *)((long)&this->NavFocusScopeIdCurrent + 3) = 0;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->CurrentColumns = (ImGuiColumns *)0x0;
  this->LayoutType = 1;
  this->ParentLayoutType = 1;
  this->FocusCounterRegular = -1;
  this->FocusCounterTabStop = -1;
  this->ItemFlags = 0;
  this->ItemWidth = 0.0;
  this->TextWrapPos = -1.0;
  this->StackSizesBackup[4] = 0;
  this->StackSizesBackup[5] = 0;
  this->StackSizesBackup[0] = 0;
  this->StackSizesBackup[1] = 0;
  this->StackSizesBackup[2] = 0;
  this->StackSizesBackup[3] = 0;
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        Indent = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);

        LastItemId = 0;
        LastItemStatusFlags = ImGuiItemStatusFlags_None;
        LastItemRect = LastItemDisplayRect = ImRect();

        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavFocusScopeIdCurrent = 0;
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;

        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        TreeDepth = 0;
        TreeJumpToParentOnPopMask = 0x00;
        StateStorage = NULL;
        CurrentColumns = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        FocusCounterRegular = FocusCounterTabStop = -1;

        ItemFlags = ImGuiItemFlags_Default_;
        ItemWidth = 0.0f;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));
    }